

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vdrawhelper_common.cpp
# Opt level: O0

void src_SourceOver(uint32_t *dest,int length,uint32_t *src,uint32_t alpha)

{
  int iVar1;
  uint uVar2;
  int in_ECX;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  int i_1;
  int i;
  uint32_t sia;
  uint32_t s;
  undefined4 local_2c;
  undefined4 local_28;
  
  if (in_ECX == 0xff) {
    for (local_28 = 0; local_28 < in_ESI; local_28 = local_28 + 1) {
      uVar2 = *(uint *)(in_RDX + (long)local_28 * 4);
      if (uVar2 < 0xff000000) {
        if (uVar2 != 0) {
          iVar1 = vAlpha(uVar2 ^ 0xffffffff);
          *(uint *)(in_RDI + (long)local_28 * 4) =
               uVar2 + ((*(uint *)(in_RDI + (long)local_28 * 4) >> 8 & 0xff00ff) * iVar1 &
                       0xff00ff00) +
                       ((*(uint *)(in_RDI + (long)local_28 * 4) & 0xff00ff) * iVar1 >> 8 & 0xff00ff)
          ;
        }
      }
      else {
        *(uint *)(in_RDI + (long)local_28 * 4) = uVar2;
      }
    }
  }
  else {
    for (local_2c = 0; local_2c < in_ESI; local_2c = local_2c + 1) {
      uVar2 = ((*(uint *)(in_RDX + (long)local_2c * 4) >> 8 & 0xff00ff) * in_ECX & 0xff00ff00) +
              ((*(uint *)(in_RDX + (long)local_2c * 4) & 0xff00ff) * in_ECX >> 8 & 0xff00ff);
      iVar1 = vAlpha(uVar2 ^ 0xffffffff);
      *(uint *)(in_RDI + (long)local_2c * 4) =
           uVar2 + ((*(uint *)(in_RDI + (long)local_2c * 4) >> 8 & 0xff00ff) * iVar1 & 0xff00ff00) +
                   ((*(uint *)(in_RDI + (long)local_2c * 4) & 0xff00ff) * iVar1 >> 8 & 0xff00ff);
    }
  }
  return;
}

Assistant:

static void src_SourceOver(uint32_t *dest, int length, const uint32_t *src,
                           uint32_t alpha)
{
    uint32_t s, sia;

    if (alpha == 255) {
        for (int i = 0; i < length; ++i) {
            s = src[i];
            if (s >= 0xff000000)
                dest[i] = s;
            else if (s != 0) {
                sia = vAlpha(~s);
                dest[i] = s + BYTE_MUL(dest[i], sia);
            }
        }
    } else {
        /* source' = source * const_alpha
         * dest = source' + dest ( 1- source'a)
         */
        for (int i = 0; i < length; ++i) {
            s = BYTE_MUL(src[i], alpha);
            sia = vAlpha(~s);
            dest[i] = s + BYTE_MUL(dest[i], sia);
        }
    }
}